

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall CFieldList::Add(CFieldList *this,CField *_field)

{
  unique_ptr<CField,_std::default_delete<CField>_> local_20;
  CField *local_18;
  CField *_field_local;
  CFieldList *this_local;
  
  local_18 = _field;
  _field_local = (CField *)this;
  std::unique_ptr<CField,std::default_delete<CField>>::unique_ptr<std::default_delete<CField>,void>
            ((unique_ptr<CField,std::default_delete<CField>> *)&local_20,_field);
  std::
  vector<std::unique_ptr<CField,_std::default_delete<CField>_>,_std::allocator<std::unique_ptr<CField,_std::default_delete<CField>_>_>_>
  ::push_back(&this->fields,(value_type *)&local_20);
  std::unique_ptr<CField,_std::default_delete<CField>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void CFieldList::Add(CField* _field) {
	fields.push_back(std::unique_ptr<CField>(_field));
}